

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void recff_ffi_fill(jit_State *J,RecordFFData *rd)

{
  TRef sp;
  uint uVar1;
  TRef *pTVar2;
  CTState *cts;
  IRRef1 IVar3;
  TRef TVar4;
  TRef TVar5;
  uint uVar6;
  cTValue *pcVar7;
  IROpT IVar8;
  CTSize CVar9;
  long *plVar10;
  uint uVar11;
  uint uVar12;
  int32_t k;
  ulong uVar13;
  ulong uVar14;
  CTSize *pCVar15;
  ulong uVar16;
  long lVar17;
  IRRef1 IVar18;
  CTSize sz;
  CTSize local_138 [66];
  
  pTVar2 = J->base;
  TVar4 = *pTVar2;
  TVar5 = pTVar2[1];
  if (TVar5 == 0 || TVar4 == 0) {
    return;
  }
  plVar10 = (long *)(ulong)J[-1].bpropcache[9].mode;
  sp = pTVar2[2];
  pcVar7 = rd->argv;
  cts = (CTState *)*plVar10;
  if ((pcVar7->field_2).it == 0xfffffff5) {
    uVar13 = (ulong)*(ushort *)((ulong)(pcVar7->u32).lo + 6);
    uVar14 = uVar13 * 0x10;
    uVar6 = *(uint *)((cts->cb).fpr + uVar13 * 2 + -6);
    if ((uVar6 & 0xf0000000) == 0x20000000) {
      uVar14 = (ulong)((uVar6 & 0xffff) << 4);
    }
    lj_ctype_info(cts,(CTypeID)(uVar14 >> 4),local_138);
  }
  TVar4 = crec_ct_tv(J,(CType *)(cts->hash + 0x1c),0,TVar4,pcVar7);
  TVar5 = crec_ct_tv(J,(CType *)(*plVar10 + 0x90),0,TVar5,rd->argv + 1);
  if (sp == 0) {
    uVar6 = lj_ir_kint(J,0);
  }
  else {
    uVar6 = crec_ct_tv(J,(CType *)(*plVar10 + 0x90),0,sp,rd->argv + 2);
  }
  uVar13 = (ulong)uVar6;
  rd->nres = 0;
  if (-1 < (short)TVar5) {
    uVar1 = (J->cur).ir[TVar5 & 0x7fff].field_1.op12;
    if (uVar1 == 0) {
      return;
    }
    if (uVar1 < 0x81) {
      CVar9 = 0x16;
      uVar11 = 0;
      uVar12 = 8;
      uVar14 = 0;
      do {
        if (uVar11 + uVar12 <= uVar1) {
          uVar16 = uVar14;
          if ((uint)uVar14 < 0x11) {
            uVar16 = 0x10;
          }
          pCVar15 = local_138 + uVar14 * 4 + 1;
          lVar17 = 0;
          do {
            if (uVar14 - uVar16 == lVar17) goto LAB_00136915;
            pCVar15[-1] = uVar11;
            *pCVar15 = CVar9;
            lVar17 = lVar17 + -1;
            pCVar15 = pCVar15 + 4;
            uVar11 = uVar11 + uVar12;
          } while (uVar12 + uVar11 <= uVar1);
          uVar14 = (ulong)((uint)uVar14 - (int)lVar17);
        }
        uVar12 = uVar12 >> 1;
        CVar9 = CVar9 - 2;
      } while (uVar11 < uVar1);
      if ((int)uVar14 != 0) {
        if (local_138[1] != 0x10 || -1 < (short)(IRRef1)uVar6) {
          (J->fold).ins.field_0.op1 = (IRRef1)uVar6;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x55130270;
          TVar5 = lj_opt_fold(J);
          uVar13 = (ulong)TVar5;
          IVar18 = (IRRef1)TVar5;
          if (local_138[1] != 0x10) {
            if (local_138[1] == 0x16) {
              if (-1 < (short)IVar18) {
                (J->fold).ins.field_0.op1 = IVar18;
                *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x551602d4;
                TVar5 = lj_opt_fold(J);
                IVar18 = (IRRef1)TVar5;
              }
              pcVar7 = lj_ir_k64_find(J,0x101010101010101);
              TVar5 = lj_ir_k64(J,IR_KINT64,pcVar7);
              IVar3 = (IRRef1)TVar5;
              IVar8 = 0x2a16;
            }
            else {
              k = 0x1010101;
              if (local_138[1] == 0x12) {
                k = 0x101;
              }
              TVar5 = lj_ir_kint(J,k);
              IVar3 = (IRRef1)TVar5;
              IVar8 = 0x2a13;
            }
            (J->fold).ins.field_0.ot = IVar8;
            (J->fold).ins.field_0.op1 = IVar18;
            (J->fold).ins.field_0.op2 = IVar3;
            TVar5 = lj_opt_fold(J);
            uVar13 = (ulong)TVar5;
          }
        }
        lVar17 = 0;
        do {
          pcVar7 = lj_ir_k64_find(J,(ulong)*(uint *)((long)local_138 + lVar17));
          TVar5 = lj_ir_k64(J,IR_KINT64,pcVar7);
          (J->fold).ins.field_0.ot = 0x2809;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
          TVar5 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = (ushort)*(undefined4 *)((long)local_138 + lVar17 + 4) | 0x4b00;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
          (J->fold).ins.field_0.op2 = (IRRef1)uVar13;
          lj_opt_fold(J);
          lVar17 = lVar17 + 0x10;
        } while (uVar14 << 4 != lVar17);
        goto LAB_0013692c;
      }
    }
  }
LAB_00136915:
  lj_ir_call(J,IRCALL_memset,(ulong)TVar4,uVar13,(ulong)TVar5);
LAB_0013692c:
  (J->fold).ins.field_0.ot = 0x5400;
  (J->fold).ins.field_1.op12 = 0;
  lj_opt_fold(J);
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_fill(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef trdst = J->base[0], trlen = J->base[1], trfill = J->base[2];
  if (trdst && trlen) {
    CTSize step = 1;
    if (tviscdata(&rd->argv[0])) {  /* Get alignment of original destination. */
      CTSize sz;
      CType *ct = ctype_raw(cts, cdataV(&rd->argv[0])->ctypeid);
      if (ctype_isptr(ct->info))
	ct = ctype_rawchild(cts, ct);
      step = (1u<<ctype_align(lj_ctype_info(cts, ctype_typeid(cts, ct), &sz)));
    }
    trdst = crec_ct_tv(J, ctype_get(cts, CTID_P_VOID), 0, trdst, &rd->argv[0]);
    trlen = crec_toint(J, cts, trlen, &rd->argv[1]);
    if (trfill)
      trfill = crec_toint(J, cts, trfill, &rd->argv[2]);
    else
      trfill = lj_ir_kint(J, 0);
    rd->nres = 0;
    crec_fill(J, trdst, trlen, trfill, step);
  }  /* else: interpreter will throw. */
}